

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::prepare_access_chain_for_scalar_access
          (CompilerMSL *this,string *expr,SPIRType *type,StorageClass storage,bool *is_packed)

{
  bool bVar1;
  char *addr_space;
  string local_80 [32];
  string local_60;
  string local_40;
  
  if ((*is_packed == false) && ((storage | Generic) == StorageBuffer)) {
    addr_space = "device";
    if (storage == StorageClassWorkgroup) {
      addr_space = "threadgroup";
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_80,this,type,0);
    CompilerGLSL::enclose_expression(&local_60,&this->super_CompilerGLSL,expr);
    join<char_const(&)[3],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&local_40,(spirv_cross *)0x336f9d,(char (*) [3])&addr_space,(char **)0x3175f1,
               (char (*) [2])local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x344fbc,
               (char (*) [4])&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3511f2,
               (char (*) [2])addr_space);
    ::std::__cxx11::string::operator=((string *)expr,(string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string(local_80);
    *is_packed = true;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CompilerMSL::prepare_access_chain_for_scalar_access(std::string &expr, const SPIRType &type,
                                                         spv::StorageClass storage, bool &is_packed)
{
	// If there is any risk of writes happening with the access chain in question,
	// and there is a risk of concurrent write access to other components,
	// we must cast the access chain to a plain pointer to ensure we only access the exact scalars we expect.
	// The MSL compiler refuses to allow component-level access for any non-packed vector types.
	if (!is_packed && (storage == StorageClassStorageBuffer || storage == StorageClassWorkgroup))
	{
		const char *addr_space = storage == StorageClassWorkgroup ? "threadgroup" : "device";
		expr = join("((", addr_space, " ", type_to_glsl(type), "*)&", enclose_expression(expr), ")");

		// Further indexing should happen with packed rules (array index, not swizzle).
		is_packed = true;
		return true;
	}
	else
		return false;
}